

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.cpp
# Opt level: O1

void __thiscall CLayers::InitTilemapSkip(CLayers *this)

{
  int iVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  char cVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  long lVar5;
  undefined4 extraout_var_01;
  
  if (0 < this->m_GroupsNum) {
    iVar13 = 0;
    do {
      iVar3 = (*(this->m_pMap->super_IInterface)._vptr_IInterface[5])
                        (this->m_pMap,(ulong)(uint)(this->m_GroupsStart + iVar13),0,0);
      lVar5 = CONCAT44(extraout_var,iVar3);
      if (0 < *(int *)(lVar5 + 0x18)) {
        iVar3 = 0;
        do {
          iVar4 = (*(this->m_pMap->super_IInterface)._vptr_IInterface[5])
                            (this->m_pMap,
                             (ulong)(uint)(*(int *)(lVar5 + 0x14) + iVar3 + this->m_LayersStart),0);
          lVar11 = CONCAT44(extraout_var_00,iVar4);
          if (*(int *)(lVar11 + 4) == 2) {
            iVar4 = (*(this->m_pMap->super_IInterface)._vptr_IInterface[2])();
            lVar6 = CONCAT44(extraout_var_01,iVar4);
            iVar4 = *(int *)(lVar11 + 0x14);
            if (0 < iVar4) {
              iVar1 = *(int *)(lVar11 + 0x10);
              iVar7 = 0;
              iVar8 = 0;
              do {
                if (1 < iVar1) {
                  iVar9 = 1;
                  do {
                    iVar12 = iVar9 + 1;
                    if (iVar12 < iVar1) {
                      lVar11 = 1;
                      if (*(char *)(lVar6 + 4 + (long)(iVar1 * iVar8 + iVar9) * 4) == '\0') {
                        lVar2 = 2;
                        do {
                          lVar11 = lVar2;
                          if ((0xfd < lVar11 - 1U) || ((long)iVar1 <= iVar9 + lVar11)) {
                            iVar12 = iVar9 + (int)lVar11;
                            goto LAB_001d5939;
                          }
                          lVar2 = lVar11 + 1;
                        } while (*(char *)(lVar6 + (long)(iVar7 + iVar9) * 4 + lVar11 * 4) == '\0');
                        iVar12 = iVar9 + (int)(lVar11 + 1) + -1;
                      }
LAB_001d5939:
                      cVar10 = (char)lVar11 + -1;
                    }
                    else {
                      cVar10 = '\0';
                    }
                    *(char *)(lVar6 + 2 + (long)(iVar9 + iVar1 * iVar8) * 4) = cVar10;
                    iVar9 = iVar12;
                  } while (iVar12 < iVar1);
                }
                iVar8 = iVar8 + 1;
                iVar7 = iVar7 + iVar1;
              } while (iVar8 != iVar4);
            }
          }
          iVar3 = iVar3 + 1;
        } while (iVar3 < *(int *)(lVar5 + 0x18));
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 < this->m_GroupsNum);
  }
  return;
}

Assistant:

void CLayers::InitTilemapSkip()
{
	for(int g = 0; g < NumGroups(); g++)
	{
		CMapItemGroup *pGroup = GetGroup(g);
		for(int l = 0; l < pGroup->m_NumLayers; l++)
		{
			CMapItemLayer *pLayer = GetLayer(pGroup->m_StartLayer+l);
			if(pLayer->m_Type == LAYERTYPE_TILES)
			{
				CMapItemLayerTilemap *pTilemap = (CMapItemLayerTilemap *)pLayer;
				CTile *pTiles = (CTile *)Map()->GetData(pTilemap->m_Data);
				for(int y = 0; y < pTilemap->m_Height; y++)
				{
					for(int x = 1; x < pTilemap->m_Width;)
					{
						int SkippedX;
						for(SkippedX = 1; x+SkippedX < pTilemap->m_Width && SkippedX < 255; SkippedX++)
						{
							if(pTiles[y*pTilemap->m_Width+x+SkippedX].m_Index)
								break;
						}

						pTiles[y*pTilemap->m_Width+x].m_Skip = SkippedX-1;
						x += SkippedX;
					}
				}
			}
		}
	}
}